

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O3

void __thiscall r_exec::PGMOverlay::reset(PGMOverlay *this)

{
  pointer puVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pcVar4;
  byte bVar5;
  ulong uVar6;
  pointer this_00;
  unsigned_short local_2a;
  
  Overlay::reset((Overlay *)this);
  InputLessPGMOverlay::patch_tpl_args(&this->super_InputLessPGMOverlay);
  puVar1 = (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (this->super_InputLessPGMOverlay).super_Overlay.value_commit_index = 0;
  pAVar2 = (this->super_InputLessPGMOverlay).super_Overlay.values.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar3 = *(pointer *)
            ((long)&(this->super_InputLessPGMOverlay).super_Overlay.values.m_vector.
                    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                    super__Vector_impl_data + 8);
  this_00 = pAVar2;
  if (pAVar3 != pAVar2) {
    do {
      r_code::Atom::~Atom(this_00);
      this_00 = this_00 + 4;
    } while (this_00 != pAVar3);
    *(pointer *)
     ((long)&(this->super_InputLessPGMOverlay).super_Overlay.values.m_vector.
             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data + 8) = pAVar2;
  }
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::clear
            (&(this->super_InputLessPGMOverlay).productions);
  puVar1 = (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_InputLessPGMOverlay).super_Overlay.patch_indices.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::clear
            (&this->input_views);
  *(undefined4 *)&(this->input_pattern_indices).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->input_pattern_indices).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->input_pattern_indices).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->input_pattern_indices).used_cells_tail + 4) = 0xffffffff;
  (this->input_pattern_indices).free_cells = -1;
  (this->input_pattern_indices).used_cell_count = 0;
  (this->input_pattern_indices).free_cell_count = 0;
  pcVar4 = (this->input_pattern_indices).cells.
           super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->input_pattern_indices).cells.
      super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar4) {
    (this->input_pattern_indices).cells.
    super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar4;
  }
  r_code::Atom::asIndex();
  bVar5 = r_code::Atom::getAtomCount();
  if (bVar5 != 0) {
    uVar6 = (ulong)bVar5;
    do {
      local_2a = r_code::Atom::asIndex();
      r_code::list<unsigned_short>::push_back(&this->input_pattern_indices,&local_2a);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  this->birth_time = 0;
  return;
}

Assistant:

inline void PGMOverlay::reset()
{
    InputLessPGMOverlay::reset();
    patch_indices.clear();
    input_views.clear();
    input_pattern_indices.clear();
    init();
}